

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::MeasuredBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,MeasuredBxDF *this)

{
  MeasuredBRDF *in_RCX;
  
  StringPrintf<pbrt::MeasuredBRDF_const&>
            (__return_storage_ptr__,(pbrt *)"[ MeasuredBxDF brdf: %s ]",(char *)this->brdf,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string MeasuredBxDF::ToString() const {
    return StringPrintf("[ MeasuredBxDF brdf: %s ]", *brdf);
}